

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFraigRestore(int nPatsRand,int nPatsDyna,int nBTLimit)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  void *Entry;
  int local_9c;
  int local_98;
  int nWordsMin;
  int nWords2;
  int nWords1;
  Abc_Ntk_t *pFraig;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *vStore;
  Fraig_Params_t Params;
  int nBTLimit_local;
  int nPatsDyna_local;
  int nPatsRand_local;
  
  Params.nInspLimit._4_4_ = nBTLimit;
  p = Abc_FrameReadStore();
  iVar1 = Vec_PtrSize(p);
  if (iVar1 == 0) {
    printf("There are no network currently in storage.\n");
    _nPatsDyna_local = (Abc_Ntk_t *)0x0;
  }
  else {
    pFraig = (Abc_Ntk_t *)Vec_PtrEntry(p,0);
    iVar1 = Vec_PtrSize(p);
    if (1 < iVar1) {
      pFraig = (Abc_Ntk_t *)Vec_PtrPop(p);
      Entry = Vec_PtrEntry(p,0);
      Vec_PtrPush(p,Entry);
      Vec_PtrWriteEntry(p,0,pFraig);
    }
    iVar1 = Abc_NtkNodeNum(pFraig);
    iVar2 = Abc_NtkCiNum(pFraig);
    iVar1 = Abc_MinInt(0x20,(int)(0x8000000 / (long)(iVar1 + iVar2)));
    Fraig_ParamsSetDefault((Fraig_Params_t *)&vStore);
    local_98 = nPatsRand;
    if (nPatsRand == 0) {
      local_98 = iVar1 << 5;
    }
    vStore._0_4_ = local_98;
    local_9c = nPatsDyna;
    if (nPatsDyna == 0) {
      local_9c = iVar1 << 5;
    }
    vStore._4_4_ = local_9c;
    Params.nPatsRand = Params.nInspLimit._4_4_;
    Params.nBTLimit = 1;
    Params.nSeconds = 1;
    Params.fFuncRed = 1;
    Params.fFeedBack = 1;
    Params.fDist1Pats = 1;
    Params.fDoSparse = 0;
    Params.fVerbose = 1;
    Params.fChoicing = 0;
    _nPatsDyna_local = Abc_NtkFraigPartitioned(p,&vStore);
    Abc_NtkFraigStoreClean();
  }
  return _nPatsDyna_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkFraigRestore( int nPatsRand, int nPatsDyna, int nBTLimit )
{
    extern Abc_Ntk_t * Abc_NtkFraigPartitioned( Vec_Ptr_t * vStore, void * pParams );
    Fraig_Params_t Params;
    Vec_Ptr_t * vStore;
    Abc_Ntk_t * pNtk, * pFraig;
    int nWords1, nWords2, nWordsMin;
//    abctime clk = Abc_Clock();

    // get the stored network
    vStore = Abc_FrameReadStore();
    if ( Vec_PtrSize(vStore) == 0 )
    {
        printf( "There are no network currently in storage.\n" );
        return NULL;
    }
//    printf( "Currently stored %d networks will be fraiged.\n", Vec_PtrSize(vStore) );
    pNtk = (Abc_Ntk_t *)Vec_PtrEntry( vStore, 0 );

    // swap the first and last network
    // this should lead to the primary choice being "better" because of synthesis
    if ( Vec_PtrSize(vStore) > 1 )
    {
        pNtk = (Abc_Ntk_t *)Vec_PtrPop( vStore );
        Vec_PtrPush( vStore, Vec_PtrEntry(vStore,0) );
        Vec_PtrWriteEntry( vStore, 0, pNtk );
    }

    // to determine the number of simulation patterns
    // use the following strategy
    // at least 64 words (32 words random and 32 words dynamic)
    // no more than 256M for one circuit (128M + 128M)
    nWords1 = 32;
    nWords2 = (1<<27) / (Abc_NtkNodeNum(pNtk) + Abc_NtkCiNum(pNtk));
    nWordsMin = Abc_MinInt( nWords1, nWords2 );

    // set parameters for fraiging
    Fraig_ParamsSetDefault( &Params );
    Params.nPatsRand  = nPatsRand ? nPatsRand : nWordsMin * 32;    // the number of words of random simulation info
    Params.nPatsDyna  = nPatsDyna ? nPatsDyna : nWordsMin * 32;    // the number of words of dynamic simulation info
    Params.nBTLimit   = nBTLimit;          // the max number of backtracks to perform
    Params.fFuncRed   =    1;              // performs only one level hashing
    Params.fFeedBack  =    1;              // enables solver feedback
    Params.fDist1Pats =    1;              // enables distance-1 patterns
    Params.fDoSparse  =    1;              // performs equiv tests for sparse functions 
    Params.fChoicing  =    1;              // enables recording structural choices
    Params.fTryProve  =    0;              // tries to solve the final miter
    Params.fInternal  =    1;              // does not show progress bar
    Params.fVerbose   =    0;              // the verbosiness flag

    // perform partitioned computation of structural choices
    pFraig = Abc_NtkFraigPartitioned( vStore, &Params );
    Abc_NtkFraigStoreClean();
//ABC_PRT( "Total choicing time", Abc_Clock() - clk );
    return pFraig;
}